

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_operators.cpp
# Opt level: O0

Matrix<long_double> *
neural_networks::utilities::matrix_operators::multiply
          (Matrix<long_double> *first,NeuralMatrix *other)

{
  longdouble lVar1;
  longdouble lVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference this;
  const_reference pvVar5;
  const_reference this_00;
  const_reference ppNVar6;
  length_error *this_01;
  ulong local_50;
  size_t k;
  size_t j;
  size_t i;
  Matrix<long_double> *product;
  NeuralMatrix *other_local;
  Matrix<long_double> *first_local;
  
  if (first->M != (other->super_Matrix<neural_networks::utilities::Neuron_*>).N) {
    this_01 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_01,"Dimension mismatch");
    __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  first_local = (Matrix<long_double> *)operator_new(0x30);
  Matrix<long_double>::Matrix
            (first_local,first->N,(other->super_Matrix<neural_networks::utilities::Neuron_*>).M);
  if (first_local == (Matrix<long_double> *)0x0) {
    first_local = (Matrix<long_double> *)0x0;
  }
  else {
    for (j = 0; j < first->N; j = j + 1) {
      for (k = 0; k < (other->super_Matrix<neural_networks::utilities::Neuron_*>).M; k = k + 1) {
        pvVar3 = std::
                 vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ::operator[](&first_local->matrix,j);
        pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar3,k);
        *(longdouble *)pvVar4 = (longdouble)0;
        for (local_50 = 0; local_50 < first->M; local_50 = local_50 + 1) {
          this = std::
                 vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ::operator[](&first->matrix,j);
          pvVar5 = std::vector<long_double,_std::allocator<long_double>_>::operator[](this,local_50)
          ;
          lVar1 = *(longdouble *)pvVar5;
          this_00 = std::
                    vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                    ::operator[](&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix
                                 ,local_50);
          ppNVar6 = std::
                    vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                    ::operator[](this_00,k);
          lVar2 = (*ppNVar6)->function;
          pvVar3 = std::
                   vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   ::operator[](&first_local->matrix,j);
          pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar3,k);
          *(longdouble *)pvVar4 = *(longdouble *)pvVar4 + lVar1 * lVar2;
        }
      }
    }
  }
  return first_local;
}

Assistant:

Matrix<long double>* matrix_operators::multiply(const Matrix<long double> *first, const NeuralMatrix *other)  {
    if(first -> M == other -> N) {
        Matrix<long double> *product = new Matrix<long double>(first -> N, other -> M);
        if(product == nullptr) {
            return nullptr;
        }
        register size_t i, j, k;
        for(i = 0; i < first -> N; ++i) {
            for(j = 0; j < other -> M; ++j) {
                product -> matrix[i][j] = 0;
                for(k = 0; k < first -> M; ++k) {
                    product -> matrix[i][j] += first -> matrix[i][k] * other -> matrix[k][j] -> function;
                }
            }
        }
        return product;
    } else {
        throw std::length_error("Dimension mismatch");
    }
}